

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

void crnlib::etc1_block::get_abs_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color4,uint table_idx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uchar uVar11;
  uchar uVar12;
  
  uVar4 = (ulong)table_idx;
  uVar8 = packed_color4 >> 4 & 0xf;
  uVar7 = packed_color4 >> 8 & 0xf;
  uVar5 = (packed_color4 & 0xf) << 4 | packed_color4 & 0xf;
  uVar8 = uVar8 << 4 | uVar8;
  uVar7 = uVar7 << 4 | uVar7;
  iVar2 = (&g_etc1_inten_tables)[uVar4 * 4];
  iVar3 = (&DAT_001b0c34)[uVar4 * 4];
  uVar10 = iVar2 + uVar7;
  uVar1 = iVar2 + uVar8;
  uVar9 = iVar2 + uVar5;
  uVar12 = 0xff;
  if (uVar10 < 0xff) {
    uVar12 = (uchar)uVar10;
  }
  uVar11 = '\0';
  if ((int)uVar10 < 0) {
    uVar12 = uVar11;
  }
  uVar6 = 0xff;
  if (uVar1 < 0xff) {
    uVar6 = (uchar)uVar1;
  }
  (pDst->field_0).field_0.r = uVar12;
  if ((int)uVar1 < 0) {
    uVar6 = uVar11;
  }
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = uVar9;
  }
  (pDst->field_0).field_0.g = uVar6;
  uVar12 = (uchar)uVar10;
  if ((int)uVar9 < 0) {
    uVar12 = uVar11;
  }
  (pDst->field_0).field_0.b = uVar12;
  uVar10 = iVar3 + uVar7;
  uVar1 = iVar3 + uVar8;
  uVar9 = iVar3 + uVar5;
  uVar12 = 0xff;
  if (uVar10 < 0xff) {
    uVar12 = (uchar)uVar10;
  }
  if ((int)uVar10 < 0) {
    uVar12 = uVar11;
  }
  uVar6 = 0xff;
  if (uVar1 < 0xff) {
    uVar6 = (uchar)uVar1;
  }
  (pDst->field_0).field_0.a = 0xff;
  if ((int)uVar1 < 0) {
    uVar6 = uVar11;
  }
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = uVar9;
  }
  pDst[1].field_0.field_0.r = uVar12;
  uVar12 = (uchar)uVar10;
  if ((int)uVar9 < 0) {
    uVar12 = '\0';
  }
  pDst[1].field_0.field_0.g = uVar6;
  pDst[1].field_0.field_0.b = uVar12;
  pDst[1].field_0.field_0.a = 0xff;
  iVar2 = *(int *)(&DAT_001b0c38 + uVar4 * 0x10);
  uVar10 = iVar2 + uVar7;
  uVar1 = iVar2 + uVar8;
  uVar9 = iVar2 + uVar5;
  uVar12 = 0xff;
  if (uVar10 < 0xff) {
    uVar12 = (uchar)uVar10;
  }
  if ((int)uVar10 < 0) {
    uVar12 = uVar11;
  }
  pDst[2].field_0.field_0.r = uVar12;
  uVar12 = 0xff;
  if (uVar1 < 0xff) {
    uVar12 = (uchar)uVar1;
  }
  if ((int)uVar1 < 0) {
    uVar12 = uVar11;
  }
  pDst[2].field_0.field_0.g = uVar12;
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = uVar9;
  }
  uVar12 = (uchar)uVar10;
  if ((int)uVar9 < 0) {
    uVar12 = uVar11;
  }
  pDst[2].field_0.field_0.b = uVar12;
  pDst[2].field_0.field_0.a = 0xff;
  iVar2 = *(int *)(&DAT_001b0c3c + uVar4 * 0x10);
  uVar7 = uVar7 + iVar2;
  uVar8 = uVar8 + iVar2;
  uVar5 = uVar5 + iVar2;
  uVar10 = 0xff;
  if (uVar7 < 0xff) {
    uVar10 = uVar7;
  }
  uVar12 = (uchar)uVar10;
  if ((int)uVar7 < 0) {
    uVar12 = uVar11;
  }
  pDst[3].field_0.field_0.r = uVar12;
  uVar10 = 0xff;
  if (uVar8 < 0xff) {
    uVar10 = uVar8;
  }
  uVar12 = (uchar)uVar10;
  if ((int)uVar8 < 0) {
    uVar12 = uVar11;
  }
  pDst[3].field_0.field_0.g = uVar12;
  uVar10 = 0xff;
  if (uVar5 < 0xff) {
    uVar10 = uVar5;
  }
  uVar12 = (uchar)uVar10;
  if ((int)uVar5 < 0) {
    uVar12 = uVar11;
  }
  pDst[3].field_0.field_0.b = uVar12;
  pDst[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void etc1_block::get_abs_subblock_colors(color_quad_u8* pDst, uint16 packed_color4, uint table_idx)
    {
        CRNLIB_ASSERT(table_idx < cETC1IntenModifierValues);
        const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

        uint r, g, b;
        unpack_color4(r, g, b, packed_color4, true);

        const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

        const int y0 = pInten_modifer_table[0];
        pDst[0].set(ir + y0, ig + y0, ib + y0);

        const int y1 = pInten_modifer_table[1];
        pDst[1].set(ir + y1, ig + y1, ib + y1);

        const int y2 = pInten_modifer_table[2];
        pDst[2].set(ir + y2, ig + y2, ib + y2);

        const int y3 = pInten_modifer_table[3];
        pDst[3].set(ir + y3, ig + y3, ib + y3);
    }